

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<double> zsign2(complex<double> z1,complex<double> z2)

{
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double __x;
  double in_XMM3_Qa;
  complex<double> cVar3;
  double zi;
  
  uVar1 = z2._M_value._0_8_;
  __x = in_XMM2_Qa * in_XMM2_Qa + in_XMM3_Qa * in_XMM3_Qa;
  if (__x < 0.0) {
    dVar2 = sqrt(__x);
    in_RAX = extraout_RAX;
    uVar1 = extraout_RDX;
  }
  else {
    dVar2 = SQRT(__x);
  }
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = in_XMM0_Qa * in_XMM0_Qa + in_XMM1_Qa * in_XMM1_Qa;
    if (dVar2 < 0.0) {
      sqrt(dVar2);
      in_RAX = extraout_RAX_00;
      uVar1 = extraout_RDX_00;
    }
    if (__x < 0.0) {
      sqrt(__x);
      in_RAX = extraout_RAX_01;
      uVar1 = extraout_RDX_01;
    }
  }
  cVar3._M_value._8_8_ = uVar1;
  cVar3._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar3._M_value;
}

Assistant:

complex <double> zsign2 ( complex <double> z1, complex <double> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    ZSIGN2 is a complex <double> transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The L2 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <double> Z1, Z2, the arguments.
//
//    Output, complex <double> ZSIGN2,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <double> value;

  if ( zabs2 ( z2 ) == 0.0 )
  {
    value = complex <double> ( 0.0, 0.0 );
  }
  else
  {
    value = zabs2 ( z1 ) * ( z2 / zabs2 ( z2 ) );
  }

  return value;
}